

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppression::SharedDtor(NonMaximumSuppression *this)

{
  ulong uVar1;
  LogMessage *other;
  undefined8 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0x1bf);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((undefined8 *)(this->confidenceinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->confidenceinputfeaturename_);
  }
  if ((undefined8 *)(this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->coordinatesinputfeaturename_);
  }
  if ((undefined8 *)(this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->iouthresholdinputfeaturename_);
  }
  if ((undefined8 *)(this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->confidencethresholdinputfeaturename_);
  }
  if ((undefined8 *)(this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->confidenceoutputfeaturename_);
  }
  if ((undefined8 *)(this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->coordinatesoutputfeaturename_);
  }
  if (this->_oneof_case_[0] != 0) {
    clear_SuppressionMethod(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

inline void NonMaximumSuppression::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  confidenceinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  coordinatesinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  iouthresholdinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  confidencethresholdinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  confidenceoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  coordinatesoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (has_SuppressionMethod()) {
    clear_SuppressionMethod();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}